

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5StructureExtendLevel(int *pRc,Fts5Structure *pStruct,int iLvl,int nExtra,int bInsert)

{
  Fts5StructureSegment *__src;
  int nMove;
  sqlite3_int64 nByte;
  Fts5StructureSegment *aNew;
  Fts5StructureLevel *pLvl;
  int bInsert_local;
  int nExtra_local;
  int iLvl_local;
  Fts5Structure *pStruct_local;
  int *pRc_local;
  
  if (*pRc == 0) {
    __src = (Fts5StructureSegment *)
            sqlite3_realloc64(pStruct->aLevel[iLvl].aSeg,
                              (long)(pStruct->aLevel[iLvl].nSeg + nExtra) * 0xc);
    if (__src == (Fts5StructureSegment *)0x0) {
      *pRc = 7;
    }
    else {
      if (bInsert == 0) {
        memset(__src + pStruct->aLevel[iLvl].nSeg,0,(long)nExtra * 0xc);
      }
      else {
        memmove(__src + nExtra,__src,(long)(pStruct->aLevel[iLvl].nSeg * 0xc));
        memset(__src,0,(long)nExtra * 0xc);
      }
      pStruct->aLevel[iLvl].aSeg = __src;
    }
  }
  return;
}

Assistant:

static void fts5StructureExtendLevel(
  int *pRc, 
  Fts5Structure *pStruct, 
  int iLvl, 
  int nExtra, 
  int bInsert
){
  if( *pRc==SQLITE_OK ){
    Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
    Fts5StructureSegment *aNew;
    sqlite3_int64 nByte;

    nByte = (pLvl->nSeg + nExtra) * sizeof(Fts5StructureSegment);
    aNew = sqlite3_realloc64(pLvl->aSeg, nByte);
    if( aNew ){
      if( bInsert==0 ){
        memset(&aNew[pLvl->nSeg], 0, sizeof(Fts5StructureSegment) * nExtra);
      }else{
        int nMove = pLvl->nSeg * sizeof(Fts5StructureSegment);
        memmove(&aNew[nExtra], aNew, nMove);
        memset(aNew, 0, sizeof(Fts5StructureSegment) * nExtra);
      }
      pLvl->aSeg = aNew;
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
}